

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_sinc.c
# Opt level: O1

char * sinc_get_name(int src_enum)

{
  if ((uint)src_enum < 3) {
    return &DAT_0026b9c0 + *(int *)(&DAT_0026b9c0 + (ulong)(uint)src_enum * 4);
  }
  return (char *)0x0;
}

Assistant:

LIBSAMPLERATE_DLL_PRIVATE const char*
sinc_get_name (int src_enum)
{
	switch (src_enum)
	{	case SRC_SINC_BEST_QUALITY :
			return "Best Sinc Interpolator" ;

		case SRC_SINC_MEDIUM_QUALITY :
			return "Medium Sinc Interpolator" ;

		case SRC_SINC_FASTEST :
			return "Fastest Sinc Interpolator" ;

		default: break ;
		} ;

	return NULL ;
}